

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel.h
# Opt level: O2

strong_ordering compareThreeWay(QModelIndex *lhs,QModelIndex *rhs)

{
  QAbstractItemModel *pQVar1;
  QAbstractItemModel *pQVar2;
  byte bVar3;
  bool bVar4;
  
  bVar4 = lhs->r < rhs->r;
  if ((lhs->r == rhs->r) && (bVar4 = lhs->c < rhs->c, lhs->c == rhs->c)) {
    bVar4 = lhs->i < rhs->i;
    if (lhs->i == rhs->i) {
      pQVar1 = (lhs->m).ptr;
      pQVar2 = (rhs->m).ptr;
      bVar3 = -(pQVar1 < pQVar2) | 1;
      if (pQVar1 == pQVar2) {
        bVar3 = 0;
      }
      return (strong_ordering)bVar3;
    }
  }
  return (strong_ordering)(-bVar4 | 1);
}

Assistant:

constexpr Qt::strong_ordering compareThreeWay(const QModelIndex &lhs, const QModelIndex &rhs) noexcept
    {
        if (auto val = Qt::compareThreeWay(lhs.r, rhs.r); !is_eq(val))
            return val;
        if (auto val = Qt::compareThreeWay(lhs.c, rhs.c); !is_eq(val))
            return val;
        if (auto val = Qt::compareThreeWay(lhs.i, rhs.i); !is_eq(val))
            return val;
        if (auto val = Qt::compareThreeWay(lhs.m, rhs.m); !is_eq(val))
            return val;
        return Qt::strong_ordering::equivalent;
    }